

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundAnalysisPreprocessingValidator.cpp
# Opt level: O3

Result * CoreML::validate<(MLModelType)2003>(Result *__return_storage_ptr__,Model *format)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  bool bVar3;
  LogMessage *other;
  undefined1 *puVar4;
  long *plVar5;
  Type *pTVar6;
  undefined8 uVar7;
  TypeUnion TVar8;
  ostream *poVar9;
  char *pcVar10;
  _Alloc_hider _Var11;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *in_R8;
  RepeatedPtrFieldBase *pRVar12;
  ModelDescription *pMVar13;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l;
  initializer_list<CoreML::Specification::FeatureType::TypeCase> __l_00;
  FeatureType outputType;
  FeatureType inputType;
  Result result;
  RepeatedField<long> arrayOutputShape;
  RepeatedField<long> arrayInputShape;
  stringstream out;
  undefined1 local_280 [36];
  uint32_t local_25c [1];
  undefined1 local_258 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_248;
  uint32_t local_234 [1];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_230;
  _Alloc_hider local_228;
  size_type local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  RepeatedField<long> local_208;
  RepeatedField<long> local_1f8;
  RepeatedPtrFieldBase *local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  RepeatedPtrFieldBase *local_1c0;
  undefined1 local_1b8 [8];
  _Alloc_hider local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pMVar13 = format->description_;
  if (pMVar13 == (ModelDescription *)0x0) {
    pMVar13 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  if (format->_oneof_case_[0] != 0x7d3) {
    local_1b8 = (undefined1  [8])local_1a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1b8,"Model not a sound analysis preprocessing.","");
    Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8);
    _Var11._M_p = (pointer)local_1b8;
    if (local_1b8 == (undefined1  [8])local_1a8) {
      return __return_storage_ptr__;
    }
    goto LAB_00315a2f;
  }
  Result::Result((Result *)&local_230);
  local_280._0_4_ = kMultiArrayType;
  __l._M_len = 1;
  __l._M_array = (iterator)local_280;
  std::
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
            *)local_258,__l,(allocator_type *)&local_1e0);
  validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
            ((Result *)local_1b8,(CoreML *)&pMVar13->input_,
             (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)local_258,in_R8
            );
  local_230 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b8;
  std::__cxx11::string::operator=((string *)&local_228,(string *)&local_1b0);
  if (local_1b0._M_p != local_1a8 + 8) {
    operator_delete(local_1b0._M_p,local_1a8._8_8_ + 1);
  }
  if ((_func_int **)local_258._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_258._0_8_,local_248._M_allocated_capacity - local_258._0_8_);
  }
  bVar3 = Result::good((Result *)&local_230);
  if (bVar3) {
    local_280._0_4_ = kMultiArrayType;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)local_280;
    std::
    vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
    ::vector((vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
              *)local_258,__l_00,(allocator_type *)&local_1e0);
    local_1c0 = &(pMVar13->output_).super_RepeatedPtrFieldBase;
    local_1e8 = &(pMVar13->input_).super_RepeatedPtrFieldBase;
    validateDescriptionsContainFeatureWithTypes<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>>
              ((Result *)local_1b8,(CoreML *)local_1c0,
               (RepeatedPtrField<CoreML::Specification::FeatureDescription> *)0x1,(int)local_258,
               in_R8);
    local_230 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1b8;
    std::__cxx11::string::operator=((string *)&local_228,(string *)&local_1b0);
    if (local_1b0._M_p != local_1a8 + 8) {
      operator_delete(local_1b0._M_p,local_1a8._8_8_ + 1);
    }
    pRVar12 = local_1e8;
    if ((_func_int **)local_258._0_8_ != (_func_int **)0x0) {
      operator_delete((void *)local_258._0_8_,local_248._M_allocated_capacity - local_258._0_8_);
    }
    bVar3 = Result::good((Result *)&local_230);
    if (!bVar3) goto LAB_003159ce;
    if (format->_oneof_case_[0] == 0x7d3) {
      puVar4 = (undefined1 *)(format->Type_).supportvectorclassifier_;
    }
    else {
      puVar4 = Specification::CoreMLModels::_SoundAnalysisPreprocessing_default_instance_;
    }
    iVar2 = *(int *)((long)&(((SupportVectorClassifier *)puVar4)->numberofsupportvectorsperclass_).
                            arena_or_elements_ + 4);
    if (iVar2 == 0) {
      local_1b8 = (undefined1  [8])local_1a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b8,"Type for sound analysis preprocessing not set","");
      Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_1b8);
      if (local_1b8 != (undefined1  [8])local_1a8) {
        operator_delete((void *)local_1b8,local_1a8._0_8_ + 1);
      }
    }
    else {
      if (iVar2 != 0x14) goto LAB_003159ce;
      if ((pMVar13->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_1b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
                   ,0x358);
        other = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_1b8,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_258,other);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_1b8);
      }
      puVar4 = *(undefined1 **)
                ((long)((pMVar13->input_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x20);
      if (puVar4 == (undefined1 *)0x0) {
        puVar4 = Specification::_FeatureType_default_instance_;
      }
      if (*(int *)(puVar4 + 0x24) == 5) {
        puVar4 = *(undefined1 **)(puVar4 + 0x18);
      }
      else {
        puVar4 = Specification::_ArrayFeatureType_default_instance_;
      }
      google::protobuf::RepeatedField<long>::RepeatedField
                (&local_1f8,(RepeatedField<long> *)(puVar4 + 0x10));
      if ((local_1f8.current_size_ == 1) &&
         (plVar5 = google::protobuf::RepeatedField<long>::elements(&local_1f8), *plVar5 == 0x3cf0))
      {
        pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (pRVar12,0);
        puVar4 = (undefined1 *)pTVar6->type_;
        if ((FeatureType *)puVar4 == (FeatureType *)0x0) {
          puVar4 = Specification::_FeatureType_default_instance_;
        }
        Specification::FeatureType::FeatureType((FeatureType *)local_258,(FeatureType *)puVar4);
        uVar7 = local_248._8_8_;
        if (local_234[0] != 5) {
          uVar7 = Specification::_ArrayFeatureType_default_instance_;
        }
        if (((ArrayFeatureType *)uVar7)->datatype_ == 0x10020) {
          pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                             (local_1c0,0);
          puVar4 = (undefined1 *)pTVar6->type_;
          if ((FeatureType *)puVar4 == (FeatureType *)0x0) {
            puVar4 = Specification::_FeatureType_default_instance_;
          }
          if (((FeatureType *)puVar4)->_oneof_case_[0] == 5) {
            puVar4 = (undefined1 *)(((FeatureType *)puVar4)->Type_).multiarraytype_;
          }
          else {
            puVar4 = Specification::_ArrayFeatureType_default_instance_;
          }
          google::protobuf::RepeatedField<long>::RepeatedField
                    (&local_208,&((ArrayFeatureType *)puVar4)->shape_);
          if ((((local_208.current_size_ == 3) &&
               (plVar5 = google::protobuf::RepeatedField<long>::Mutable(&local_208,0), *plVar5 == 1)
               ) && (plVar5 = google::protobuf::RepeatedField<long>::Mutable(&local_208,1),
                    *plVar5 == 0x60)) &&
             (plVar5 = google::protobuf::RepeatedField<long>::Mutable(&local_208,2), *plVar5 == 0x40
             )) {
            pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                               (local_1c0,0);
            puVar4 = (undefined1 *)pTVar6->type_;
            if ((FeatureType *)puVar4 == (FeatureType *)0x0) {
              puVar4 = Specification::_FeatureType_default_instance_;
            }
            Specification::FeatureType::FeatureType((FeatureType *)local_280,(FeatureType *)puVar4);
            TVar8 = (TypeUnion)local_280._24_8_;
            if (local_25c[0] != 5) {
              TVar8 = (TypeUnion)Specification::_ArrayFeatureType_default_instance_;
            }
            if ((TVar8.multiarraytype_)->datatype_ == 0x10020) {
              Specification::FeatureType::~FeatureType((FeatureType *)local_280);
              google::protobuf::RepeatedField<long>::~RepeatedField(&local_208);
              Specification::FeatureType::~FeatureType((FeatureType *)local_258);
              google::protobuf::RepeatedField<long>::~RepeatedField(&local_1f8);
              goto LAB_003159ce;
            }
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Unsupported array type \"",0x18);
            if (local_25c[0] != 5) {
              local_280._24_8_ = Specification::_ArrayFeatureType_default_instance_;
            }
            iVar2 = ((ArrayFeatureType *)local_280._24_8_)->datatype_;
            if (iVar2 < 0x10020) {
              if (iVar2 == 0) {
                pcVar10 = "INVALID";
              }
              else {
                pcVar10 = "MLArrayDataTypeFLOAT16";
              }
            }
            else if (iVar2 == 0x20020) {
              pcVar10 = "MLArrayDataTypeINT32";
            }
            else {
              pRVar12 = local_1e8;
              if (iVar2 == 0x10040) {
                pcVar10 = "MLArrayDataTypeDOUBLE";
              }
              else {
                pcVar10 = "MLArrayDataTypeFLOAT32";
              }
            }
            poVar9 = std::operator<<((ostream *)local_1a8,pcVar10);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" for feature \"",0xf);
            pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                     Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                               (pRVar12,0);
            std::operator+(&local_1e0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((ulong)(pTVar6->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),"\". ");
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar9,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Should be of: ",0xe);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"MLArrayDataTypeFLOAT32",0x16)
            ;
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
            std::endl<char,std::char_traits<char>>(poVar9);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringbuf::str();
            Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&local_1e0
                          );
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
              operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            std::ios_base::~ios_base(local_138);
            Specification::FeatureType::~FeatureType((FeatureType *)local_280);
          }
          else {
            std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,
                       "Incorrect output shape, should be 3-dimension, of size: ",0x38);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"x",1);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x60);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"x",1);
            poVar9 = (ostream *)std::ostream::operator<<((ostream *)poVar9,0x40);
            std::endl<char,std::char_traits<char>>(poVar9);
            std::__cxx11::stringbuf::str();
            Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                           (string *)local_280);
            if ((undefined1 *)CONCAT44(local_280._4_4_,local_280._0_4_) != local_280 + 0x10) {
              operator_delete((undefined1 *)CONCAT44(local_280._4_4_,local_280._0_4_),
                              local_280._16_8_ + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            std::ios_base::~ios_base(local_138);
          }
          google::protobuf::RepeatedField<long>::~RepeatedField(&local_208);
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Unsupported array type \"",0x18);
          if (local_234[0] != 5) {
            local_248._8_8_ = Specification::_ArrayFeatureType_default_instance_;
          }
          iVar2 = ((ArrayFeatureType *)local_248._8_8_)->datatype_;
          if (iVar2 < 0x10020) {
            if (iVar2 == 0) {
              pcVar10 = "INVALID";
            }
            else {
              pcVar10 = "MLArrayDataTypeFLOAT16";
            }
          }
          else if (iVar2 == 0x20020) {
            pcVar10 = "MLArrayDataTypeINT32";
          }
          else if (iVar2 == 0x10040) {
            pcVar10 = "MLArrayDataTypeDOUBLE";
          }
          else {
            pcVar10 = "MLArrayDataTypeFLOAT32";
          }
          poVar9 = std::operator<<((ostream *)local_1a8,pcVar10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" for feature \"",0xf);
          pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
                   Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                             (pRVar12,0);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_280,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(pTVar6->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe),"\". ");
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(char *)CONCAT44(local_280._4_4_,local_280._0_4_),
                              local_280._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Should be of: ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"MLArrayDataTypeFLOAT32",0x16);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,".",1);
          std::endl<char,std::char_traits<char>>(poVar9);
          if ((undefined1 *)CONCAT44(local_280._4_4_,local_280._0_4_) != local_280 + 0x10) {
            operator_delete((undefined1 *)CONCAT44(local_280._4_4_,local_280._0_4_),
                            local_280._16_8_ + 1);
          }
          std::__cxx11::stringbuf::str();
          Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                         (string *)local_280);
          if ((undefined1 *)CONCAT44(local_280._4_4_,local_280._0_4_) != local_280 + 0x10) {
            operator_delete((undefined1 *)CONCAT44(local_280._4_4_,local_280._0_4_),
                            local_280._16_8_ + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
        }
        Specification::FeatureType::~FeatureType((FeatureType *)local_258);
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"Incorrect input shape, should be 1-dimension, of length: ",
                   0x39);
        plVar5 = (long *)std::ostream::operator<<((ostream *)local_1a8,0x3cf0);
        std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
        std::ostream::put((char)plVar5);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,
                       (string *)local_258);
        if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
          operator_delete((void *)local_258._0_8_,(ulong)(local_248._M_allocated_capacity + 1));
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
        std::ios_base::~ios_base(local_138);
      }
      google::protobuf::RepeatedField<long>::~RepeatedField(&local_1f8);
    }
  }
  else {
LAB_003159ce:
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)__return_storage_ptr__ = local_230;
    paVar1 = &(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_dataplus._M_p = (pointer)paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_p == &local_218) {
      paVar1->_M_allocated_capacity =
           CONCAT71(local_218._M_allocated_capacity._1_7_,local_218._M_local_buf[0]);
      *(undefined8 *)((long)&(__return_storage_ptr__->m_message).field_2 + 8) = local_218._8_8_;
    }
    else {
      (__return_storage_ptr__->m_message)._M_dataplus._M_p = local_228._M_p;
      (__return_storage_ptr__->m_message).field_2._M_allocated_capacity =
           CONCAT71(local_218._M_allocated_capacity._1_7_,local_218._M_local_buf[0]);
    }
    (__return_storage_ptr__->m_message)._M_string_length = local_220;
    local_220 = 0;
    local_218._M_local_buf[0] = '\0';
    local_228._M_p = (pointer)&local_218;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_p == &local_218) {
    return __return_storage_ptr__;
  }
  local_1a8._0_8_ = CONCAT71(local_218._M_allocated_capacity._1_7_,local_218._M_local_buf[0]);
  _Var11._M_p = local_228._M_p;
LAB_00315a2f:
  operator_delete(_Var11._M_p,local_1a8._0_8_ + 1);
  return __return_storage_ptr__;
}

Assistant:

Result validate<MLModelType_soundAnalysisPreprocessing>(const Specification::Model &format) {
        const auto &interface = format.description();
        
        // make sure model is a sound analysis preprocessing
        if (!format.has_soundanalysispreprocessing()) {
            return Result(ResultType::INVALID_MODEL_PARAMETERS, "Model not a sound analysis preprocessing.");
        }
        
        Result result;
        
        // validate the inputs: only one input with multiarray type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.input(), 1, {Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }

        // validate the outputs: only one output with multiarray type is allowed
        result = validateDescriptionsContainFeatureWithTypes(interface.output(), 1, {Specification::FeatureType::kMultiArrayType});
        if (!result.good()) {
            return result;
        }

        // other validate logics here
        const auto &soundAnalysisPreprocessing = format.soundanalysispreprocessing();
        switch (soundAnalysisPreprocessing.SoundAnalysisPreprocessingType_case()) {
            case Specification::CoreMLModels::SoundAnalysisPreprocessing::kVggish:
            {
                // validate input shape for VGGish preprocessing
                auto arrayInputShape = interface.input(0).type().multiarraytype().shape();
                if (arrayInputShape.size() != 1 || arrayInputShape[0] != FRONTEND_PROCESSING_INPUT_LENGTH) {
                    std::stringstream out;
                    out << "Incorrect input shape, should be 1-dimension, of length: "<<FRONTEND_PROCESSING_INPUT_LENGTH<<std::endl;
                    return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
                }

                // validate input data type
                auto inputType = interface.input(0).type();
                if (inputType.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_FLOAT32) {
                    std::stringstream out;
                    out << "Unsupported array type \"" << MLArrayDataType_Name(static_cast<MLArrayDataType>(inputType.multiarraytype().datatype()))
                    << "\" for feature \"" << interface.input(0).name() + "\". "
                    << "Should be of: " << MLArrayDataType_Name(static_cast<MLArrayDataType>(Specification::ArrayFeatureType_ArrayDataType_FLOAT32))
                    << "." << std::endl;
                    return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
                }

                // validate output shape
                auto arrayOutputShape = interface.output(0).type().multiarraytype().shape();
                if (arrayOutputShape.size() != 3 || arrayOutputShape[0] != 1
                    || arrayOutputShape[1] != FRONTEND_PROCESSING_OUTPUT_NUM_FRAMES
                    || arrayOutputShape[2] != FRONTEND_PROCESSING_OUTPUT_NUM_BANDS) {
                    std::stringstream out;
                    out << "Incorrect output shape, should be 3-dimension, of size: "<<1<<"x"<<FRONTEND_PROCESSING_OUTPUT_NUM_FRAMES<<"x"<<FRONTEND_PROCESSING_OUTPUT_NUM_BANDS<<std::endl;
                    return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
                }

                // validate output data type
                auto outputType = interface.output(0).type();
                if (outputType.multiarraytype().datatype() != Specification::ArrayFeatureType_ArrayDataType_FLOAT32) {
                    std::stringstream out;
                    out << "Unsupported array type \"" << MLArrayDataType_Name(static_cast<MLArrayDataType>(outputType.multiarraytype().datatype()))
                    << "\" for feature \"" << interface.input(0).name() + "\". "
                    << "Should be of: " << MLArrayDataType_Name(static_cast<MLArrayDataType>(Specification::ArrayFeatureType_ArrayDataType_FLOAT32))
                    << "." << std::endl;
                    return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
                }

                break;
            }
            case Specification::CoreMLModels::SoundAnalysisPreprocessing::SOUNDANALYSISPREPROCESSINGTYPE_NOT_SET:
                return Result(ResultType::INVALID_MODEL_PARAMETERS, "Type for sound analysis preprocessing not set");
        }
        
        return result;
    }